

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmEval.cpp
# Opt level: O3

bool __thiscall
InstructionVMEvalContext::Storage::Reserve
          (Storage *this,InstructionVMEvalContext *ctx,uint offset,uint size)

{
  uint newSize;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar1 = (this->data).count;
  uVar3 = offset + size;
  uVar2 = ctx->frameMemoryLimit;
  if (uVar1 < uVar3 && uVar3 < uVar2) {
    newSize = uVar3 + 0x20;
    if ((this->data).max <= newSize) {
      SmallArray<char,_128U>::grow(&this->data,newSize);
    }
    (this->data).count = newSize;
    if (newSize <= uVar1) {
      __assert_fail("index < count",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                    ,0x199,"T &SmallArray<char, 128>::operator[](unsigned int) [T = char, N = 128]")
      ;
    }
    memset((this->data).data + uVar1,0,(ulong)(newSize - uVar1));
  }
  return uVar3 < uVar2;
}

Assistant:

bool InstructionVMEvalContext::Storage::Reserve(InstructionVMEvalContext &ctx, unsigned offset, unsigned size)
{
	unsigned oldSize = data.size();
	unsigned newSize = offset + size;

	if(newSize >= ctx.frameMemoryLimit)
		return false;

	if(newSize > oldSize)
	{
		data.resize(newSize + 32);

		memset(&data[oldSize], 0, data.size() - oldSize);
	}

	return true;
}